

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tri_fitness(REF_NODE ref_node,REF_INT *nodes,REF_DBL *fitness)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_150;
  double local_140;
  double local_138;
  double local_128;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL hy;
  REF_DBL hx;
  REF_DBL num;
  REF_DBL s;
  REF_INT node2;
  REF_INT node1;
  REF_INT node0;
  REF_INT i;
  REF_DBL rhy [3];
  double local_c8;
  REF_DBL r13 [3];
  double local_a8;
  REF_DBL r12 [3];
  double local_88;
  REF_DBL e20 [3];
  double local_68;
  REF_DBL e12 [3];
  double local_48;
  REF_DBL e01 [3];
  REF_DBL *fitness_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  *fitness = -1.0;
  for (node1 = 0; node1 < 3; node1 = node1 + 1) {
    e01[(long)node1 + -1] =
         ref_node->real[node1 + nodes[1] * 0xf] - ref_node->real[node1 + *nodes * 0xf];
    e12[(long)node1 + -1] =
         ref_node->real[node1 + nodes[2] * 0xf] - ref_node->real[node1 + nodes[1] * 0xf];
    e20[(long)node1 + -1] =
         ref_node->real[node1 + *nodes * 0xf] - ref_node->real[node1 + nodes[2] * 0xf];
  }
  node2 = 0;
  if ((e01[1] * e01[1] + local_48 * local_48 + e01[0] * e01[0] <=
       e12[1] * e12[1] + local_68 * local_68 + e12[0] * e12[0]) &&
     (e20[1] * e20[1] + local_88 * local_88 + e20[0] * e20[0] <=
      e12[1] * e12[1] + local_68 * local_68 + e12[0] * e12[0])) {
    node2 = 1;
  }
  if ((e01[1] * e01[1] + local_48 * local_48 + e01[0] * e01[0] <=
       e20[1] * e20[1] + local_88 * local_88 + e20[0] * e20[0]) &&
     (e12[1] * e12[1] + local_68 * local_68 + e12[0] * e12[0] <=
      e20[1] * e20[1] + local_88 * local_88 + e20[0] * e20[0])) {
    node2 = 2;
  }
  s._4_4_ = node2 + 1;
  s._0_4_ = node2 + 2;
  if (2 < s._4_4_) {
    s._4_4_ = node2 - 2;
  }
  if (2 < s._0_4_) {
    s._0_4_ = node2 - 1;
  }
  for (node1 = 0; node1 < 3; node1 = node1 + 1) {
    r12[(long)node1 + -1] =
         ref_node->real[node1 + nodes[(int)s._4_4_] * 0xf] -
         ref_node->real[node1 + nodes[node2] * 0xf];
    r13[(long)node1 + -1] =
         ref_node->real[node1 + nodes[(int)s._0_4_] * 0xf] -
         ref_node->real[node1 + nodes[node2] * 0xf];
  }
  if ((r12[1] * r12[1] + local_a8 * local_a8 + r12[0] * r12[0]) * 1e+20 <= 0.0) {
    local_128 = -((r12[1] * r12[1] + local_a8 * local_a8 + r12[0] * r12[0]) * 1e+20);
  }
  else {
    local_128 = (r12[1] * r12[1] + local_a8 * local_a8 + r12[0] * r12[0]) * 1e+20;
  }
  if (r12[1] * r13[1] + local_a8 * local_c8 + r12[0] * r13[0] <= 0.0) {
    local_138 = -(r12[1] * r13[1] + local_a8 * local_c8 + r12[0] * r13[0]);
  }
  else {
    local_138 = r12[1] * r13[1] + local_a8 * local_c8 + r12[0] * r13[0];
  }
  if (local_128 <= local_138) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x9a5,
           "ref_node_tri_fitness",4,"divide by longest edge");
    ref_node_local._4_4_ = 4;
  }
  else {
    dVar1 = (r12[1] * r13[1] + local_a8 * local_c8 + r12[0] * r13[0]) /
            (r12[1] * r12[1] + local_a8 * local_a8 + r12[0] * r12[0]);
    dVar2 = sqrt(r12[1] * r12[1] + local_a8 * local_a8 + r12[0] * r12[0]);
    for (node1 = 0; node1 < 3; node1 = node1 + 1) {
      *(double *)(&node0 + (long)node1 * 2) = -dVar1 * r12[(long)node1 + -1] + r13[(long)node1 + -1]
      ;
    }
    dVar3 = sqrt(rhy[1] * rhy[1] + _node0 * _node0 + rhy[0] * rhy[0]);
    dVar1 = dVar2 * 0.5 * (-dVar1 * dVar1 + dVar1);
    if (dVar3 * 1e+20 <= 0.0) {
      local_140 = -(dVar3 * 1e+20);
    }
    else {
      local_140 = dVar3 * 1e+20;
    }
    local_150 = dVar1;
    if (dVar1 <= 0.0) {
      local_150 = -dVar1;
    }
    if (local_140 <= local_150) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x9b1,
             "ref_node_tri_fitness",4,"divide by longest edge");
      ref_node_local._4_4_ = 4;
    }
    else {
      *fitness = dVar1 / dVar3;
      ref_node_local._4_4_ = 0;
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_fitness(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *fitness) {
  REF_DBL e01[3], e12[3], e20[3], r12[3], r13[3], rhy[3];
  REF_INT i, node0, node1, node2;
  REF_DBL s, num, hx, hy;

  *fitness = -1.0;

  node0 = 0;
  node1 = 1;
  node2 = 2;
  for (i = 0; i < 3; i++) {
    e01[i] = ref_node_xyz(ref_node, i, nodes[node1]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
    e12[i] = ref_node_xyz(ref_node, i, nodes[node2]) -
             ref_node_xyz(ref_node, i, nodes[node1]);
    e20[i] = ref_node_xyz(ref_node, i, nodes[node0]) -
             ref_node_xyz(ref_node, i, nodes[node2]);
  }
  node0 = 0;
  if (ref_math_dot(e12, e12) >= ref_math_dot(e01, e01) &&
      ref_math_dot(e12, e12) >= ref_math_dot(e20, e20))
    node0 = 1;
  if (ref_math_dot(e20, e20) >= ref_math_dot(e01, e01) &&
      ref_math_dot(e20, e20) >= ref_math_dot(e12, e12))
    node0 = 2;
  node1 = node0 + 1;
  node2 = node0 + 2;
  if (node1 > 2) node1 -= 3;
  if (node2 > 2) node2 -= 3;

  for (i = 0; i < 3; i++) {
    r12[i] = ref_node_xyz(ref_node, i, nodes[node1]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
    r13[i] = ref_node_xyz(ref_node, i, nodes[node2]) -
             ref_node_xyz(ref_node, i, nodes[node0]);
  }
  if (ref_math_divisible(ref_math_dot(r12, r13), ref_math_dot(r12, r12))) {
    s = ref_math_dot(r12, r13) / ref_math_dot(r12, r12);
  } else {
    s = 0.0;
    RSS(REF_DIV_ZERO, "divide by longest edge");
  }
  hx = sqrt(ref_math_dot(r12, r12));
  for (i = 0; i < 3; i++) {
    rhy[i] = (r13[i] - s * r12[i]);
  }
  hy = sqrt(ref_math_dot(rhy, rhy));

  num = 0.5 * hx * (s - s * s);
  if (ref_math_divisible(num, hy)) {
    *fitness = num / hy;
  } else {
    RSS(REF_DIV_ZERO, "divide by longest edge");
  }

  return REF_SUCCESS;
}